

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

HighsDomainChange __thiscall HighsDomain::backtrack(HighsDomain *this)

{
  pointer *ppiVar1;
  bool bVar2;
  Reason reason;
  pointer ppVar3;
  pointer pHVar4;
  pointer pHVar5;
  pointer pRVar6;
  pointer piVar7;
  undefined8 uVar8;
  pointer pHVar9;
  long lVar10;
  int iVar11;
  vector<int,_std::allocator<int>_> *pvVar12;
  uint uVar13;
  uint uVar14;
  ulong __new_size;
  double dVar15;
  HighsDomainChange HVar16;
  undefined8 local_50;
  HighsDomainChange local_40;
  
  bVar2 = this->infeasible_;
  reason = this->infeasible_reason;
  uVar13 = (uint)((ulong)((long)(this->domchgstack_).
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->domchgstack_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if ((bVar2 == true) && (this->infeasible_pos == uVar13)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
  }
  do {
    uVar14 = uVar13;
    uVar13 = uVar14 - 1;
    if ((int)uVar13 < 0) goto LAB_0029bf21;
    pHVar9 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar3 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40.boundval = ppVar3[uVar13].first;
    pvVar12 = &this->colUpperPos_;
    if (pHVar9[uVar13].boundtype == kLower) {
      pvVar12 = &this->colLowerPos_;
    }
    (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start[pHVar9[uVar13].column] = ppVar3[uVar13].second;
    local_40.column = pHVar9[uVar13].column;
    local_40.boundtype = pHVar9[uVar13].boundtype;
    doChangeBound(this,&local_40);
    if ((this->infeasible_ == true) && (this->infeasible_pos == uVar13)) {
      this->infeasible_ = false;
      (this->infeasible_reason).type = -2;
      (this->infeasible_reason).index = 0;
    }
  } while ((this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13].type != -1);
  ppiVar1 = &(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppiVar1 = *ppiVar1 + -1;
LAB_0029bf21:
  if (bVar2 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  iVar11 = (int)((ulong)((long)(this->domchgreason_).
                               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgreason_).
                              super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar14 < iVar11) {
    lVar10 = (long)(int)uVar14;
    iVar11 = ~uVar13 + iVar11;
    do {
      markPropagateCut(this,(this->domchgreason_).
                            super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar10]);
      lVar10 = lVar10 + 1;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  if ((int)uVar13 < 0) {
    pHVar9 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgstack_).
        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar9) {
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar9;
    }
    ppVar3 = (this->prevboundval_).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->prevboundval_).
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish != ppVar3) {
      (this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar3;
    }
    pRVar6 = (this->domchgreason_).
             super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->domchgreason_).
        super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
        super__Vector_impl_data._M_finish != pRVar6) {
      (this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish = pRVar6;
    }
    piVar7 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = 0xffffffff;
    dVar15 = 0.0;
    uVar8 = 0xffffffff;
    if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar7) {
      (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar7;
      uVar8 = local_50;
    }
  }
  else {
    __new_size = (ulong)uVar13;
    pHVar9 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar4 = (this->domchgstack_).
             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar15 = pHVar9[__new_size].boundval;
    uVar8._0_4_ = pHVar9[__new_size].column;
    uVar8._4_4_ = pHVar9[__new_size].boundtype;
    if ((pHVar9 + __new_size != pHVar4) &&
       (pHVar5 = (this->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_finish,
       pHVar9 = (pointer)((long)(pHVar9 + __new_size) + ((long)pHVar5 - (long)pHVar4)),
       pHVar5 != pHVar9)) {
      (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish = pHVar9;
    }
    std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::resize
              (&this->domchgreason_,__new_size);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
              (&this->prevboundval_,__new_size);
  }
  local_50 = uVar8;
  HVar16.column = (undefined4)local_50;
  HVar16.boundtype = local_50._4_4_;
  HVar16.boundval = dVar15;
  return HVar16;
}

Assistant:

HighsDomainChange HighsDomain::backtrack() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }
  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    // change back to global bound
    doChangeBound(
        {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    if (domchgreason_[k].type == Reason::kBranching) {
      branchPos_.pop_back();
      break;
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  if (k < 0) {
    domchgstack_.clear();
    prevboundval_.clear();
    domchgreason_.clear();
    branchPos_.clear();
    return HighsDomainChange({0.0, -1, HighsBoundType::kLower});
  }

  HighsDomainChange backtrackboundchg = domchgstack_[k];
  domchgstack_.erase(domchgstack_.begin() + k, domchgstack_.end());
  domchgreason_.resize(k);
  prevboundval_.resize(k);

  return backtrackboundchg;
}